

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result * __thiscall
testing::internal::
FunctionMocker<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::PerformDefaultAction
          (Result *__return_storage_ptr__,
          FunctionMocker<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *this_01;
  runtime_error *this_02;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  string message;
  long *local_60 [2];
  long local_50 [2];
  ArgumentTuple local_40;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (ppvVar3 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
               *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
            ::Matches(this_00,args);
    if (bVar2) {
      this_01 = OnCallSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
                ::GetAction(this_00);
      local_40.super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
      super__Tuple_impl<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
      super__Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>._M_head_impl =
           (_Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>)
           (args->super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
           super__Tuple_impl<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
           super__Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>._M_head_impl;
      local_40.super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
      super__Head_base<0UL,_int,_false>._M_head_impl =
           (args->super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
           super__Head_base<0UL,_int,_false>._M_head_impl;
      Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
      ::Perform(__return_storage_ptr__,this_01,&local_40);
      return __return_storage_ptr__;
    }
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_60);
  if (DefaultValue<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>>
      ::producer_ == (long *)0x0) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,(string *)local_60);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (**(code **)(*DefaultValue<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>>
                ::producer_ + 0x10))(__return_storage_ptr__);
  if (local_60[0] == local_50) {
    return __return_storage_ptr__;
  }
  operator_delete(local_60[0],local_50[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }